

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 in_register_0000003c;
  long *plVar6;
  _Alloc_hider _Var7;
  pointer pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uint uVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  text local_110;
  text local_f0;
  text local_d0;
  text local_b0;
  fd_set *local_90;
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar6 = (long *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar9 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar6,plVar6[1] + *plVar6);
    bVar4 = hidden(&local_68);
    uVar10 = (uint)CONCAT71(extraout_var,bVar4) ^ 1;
    _Var7._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar9) goto LAB_00110cf0;
  }
  else {
    bVar4 = false;
    pbVar8 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar11 = (long *)__readfds->fds_bits[1];
    local_90 = __readfds;
    do {
      plVar2 = plVar11;
      plVar11 = plVar2 + -4;
      plVar1 = (long *)local_90->fds_bits[0];
      if (plVar2 == plVar1) {
        uVar10 = (uint)pbVar8;
        break;
      }
      iVar5 = std::__cxx11::string::compare((char *)plVar11);
      __exceptfds = (fd_set *)CONCAT71((int7)((ulong)__exceptfds >> 8),1);
      if (iVar5 == 0) {
        bVar3 = false;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)plVar11);
        if (iVar5 != 0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,*plVar11,plVar2[-3] + *plVar11);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_b0,*plVar6,plVar6[1] + *plVar6)
          ;
          bVar3 = search(&local_d0,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (!bVar3) {
            if (*(char *)*plVar11 == '!') {
              std::__cxx11::string::substr((ulong)&local_130,(ulong)plVar11);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              if (local_130 == &local_120) {
                local_110.field_2._8_4_ = local_120._8_4_;
                local_110.field_2._12_4_ = local_120._12_4_;
              }
              else {
                local_110._M_dataplus._M_p = (pointer)local_130;
              }
              local_110.field_2._M_allocated_capacity._4_4_ = local_120._M_allocated_capacity._4_4_;
              local_110.field_2._M_allocated_capacity._0_4_ = local_120._M_allocated_capacity._0_4_;
              local_110._M_string_length = local_128;
              local_128 = 0;
              local_120._M_allocated_capacity._0_4_ =
                   local_120._M_allocated_capacity._0_4_ & 0xffffff00;
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              local_130 = &local_120;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,*plVar6,plVar6[1] + *plVar6);
              bVar3 = search(&local_110,&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,
                                CONCAT44(local_120._M_allocated_capacity._4_4_,
                                         local_120._M_allocated_capacity._0_4_) + 1);
              }
              bVar3 = !bVar3;
              pbVar8 = (pointer)CONCAT71((int7)((ulong)pbVar8 >> 8),(byte)pbVar8 & bVar3);
              bVar4 = true;
            }
            else {
              bVar3 = true;
              bVar4 = false;
            }
            __exceptfds = (fd_set *)((ulong)pbVar8 & 0xffffffff);
            goto LAB_00110c21;
          }
        }
        bVar3 = false;
        __exceptfds = (fd_set *)CONCAT71((int7)((ulong)__exceptfds >> 8),1);
      }
LAB_00110c21:
      uVar10 = (uint)__exceptfds;
      pbVar8 = (pointer)((ulong)__exceptfds & 0xffffffff);
    } while (bVar3);
    if (plVar2 != plVar1) goto LAB_00110cf0;
    if (bVar4) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar6,plVar6[1] + *plVar6);
      bVar3 = hidden(&local_88);
      uVar10 = (uint)CONCAT71(extraout_var_00,bVar3) ^ 1;
    }
    else {
      uVar10 = 0;
    }
    paVar9 = &local_88.field_2;
    _Var7._M_p = local_88._M_dataplus._M_p;
    if (!(bool)(bVar4 & (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != paVar9)) goto LAB_00110cf0;
  }
  operator_delete(_Var7._M_p,paVar9->_M_allocated_capacity + 1);
LAB_00110cf0:
  return uVar10 & 0xffffff01;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}